

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoSift.c
# Opt level: O2

void reoReorderSift(reo_man *p)

{
  reo_plane *prVar1;
  uint uVar2;
  long lVar3;
  double *pdVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  char *__assertion;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double local_50;
  double local_48;
  double local_40;
  
  uVar2 = p->nSupp;
  if ((int)uVar2 < 1) {
    __assertion = "p->nSupp > 0";
    uVar2 = 0x37;
  }
  else {
    if (p->fMinWidth == 0) {
      if (p->fMinApl == 0) {
        local_50 = (double)p->nNodesCur;
      }
      else {
        local_50 = p->nAplCur;
      }
    }
    else {
      local_50 = (double)p->nWidthCur;
    }
    local_40 = (double)((int)(local_50 * 1.15) + 1);
    iVar9 = 0;
    while( true ) {
      uVar6 = (ulong)uVar2;
      if ((int)uVar2 <= iVar9) {
        lVar3 = 0;
        if ((int)uVar2 < 1) {
          uVar6 = 0;
        }
        for (; uVar6 * 0x38 - lVar3 != 0; lVar3 = lVar3 + 0x38) {
          *(undefined4 *)((long)&p->pPlanes->fSifted + lVar3) = 0;
        }
        return;
      }
      lVar3 = 4;
      dVar16 = -1.0;
      uVar15 = 0xffffffffffffffff;
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        p->pVarCosts[uVar7] = 10000000.0;
        if ((*(int *)((long)p->pPlanes + lVar3 + -4) == 0) &&
           (dVar17 = (double)*(int *)((long)&p->pPlanes->fSifted + lVar3), dVar16 < dVar17)) {
          uVar15 = uVar7 & 0xffffffff;
          dVar16 = dVar17;
        }
        lVar3 = lVar3 + 0x38;
      }
      uVar11 = (uint)uVar15;
      if (uVar11 == 0xffffffff) break;
      prVar1 = p->pPlanes;
      uVar13 = (ulong)(int)uVar11;
      prVar1[uVar13].fSifted = 1;
      p->pVarCosts[uVar13] = local_50;
      prVar1->statsCostAbove = 0.0;
      uVar7 = 0;
      if (0 < (int)uVar11) {
        uVar7 = uVar15 & 0xffffffff;
      }
      local_48 = local_50;
      if ((int)uVar11 < (int)uVar2 / 2) {
        for (lVar3 = 0; uVar7 * 0x38 - lVar3 != 0; lVar3 = lVar3 + 0x38) {
          *(double *)((long)&prVar1[1].statsCostAbove + lVar3) =
               *(double *)((long)&prVar1->statsCostAbove + lVar3) +
               *(double *)((long)&prVar1->statsCost + lVar3);
        }
        lVar3 = (long)(int)uVar2;
        pdVar4 = &prVar1[lVar3].statsCostBelow;
        dVar16 = 0.0;
        for (; *pdVar4 = dVar16, (long)uVar13 < lVar3; lVar3 = lVar3 + -1) {
          dVar16 = *pdVar4 + pdVar4[-2];
          pdVar4 = pdVar4 + -7;
        }
        dVar16 = prVar1[uVar13].statsCostAbove + prVar1[uVar13].statsCost +
                 prVar1[uVar13].statsCostBelow;
        if ((local_50 != dVar16) || (NAN(local_50) || NAN(dVar16))) {
          __assertion = 
          "CostCurrent == p->pPlanes[VarCurrent].statsCostAbove + p->pPlanes[VarCurrent].statsCost + p->pPlanes[VarCurrent].statsCostBelow"
          ;
          uVar2 = 0x76;
          goto LAB_0067e4eb;
        }
        uVar6 = uVar15 & 0xffffffff;
        lVar3 = uVar6 * 0x38 + 0x28;
        while (uVar8 = (uint)uVar6, uVar2 = (int)uVar11 >> 0x1f & uVar11, 0 < (int)uVar8) {
          uVar6 = uVar6 - 1;
          dVar16 = reoReorderSwapAdjacentVars(p,(int)uVar6,1);
          local_50 = local_50 - dVar16;
          uVar7 = uVar6 & 0xffffffff;
          p->pVarCosts[uVar7] = local_50;
          prVar1 = p->pPlanes;
          dVar16 = *(double *)((long)&prVar1->fSifted + lVar3) +
                   *(double *)((long)prVar1 + lVar3 + -0x10);
          prVar1[uVar7].statsCostBelow = dVar16;
          uVar2 = uVar8;
          if ((local_40 <= local_50) ||
             (local_48 <=
              dVar16 + (prVar1[uVar7].statsCostAbove + prVar1[uVar7].statsCostAbove) / 3.0)) break;
          if (local_50 < local_48) {
            dVar16 = (double)((int)(local_50 * 1.15) + 1);
            if (local_40 <= dVar16) {
              dVar16 = local_40;
            }
            uVar15 = uVar6 & 0xffffffff;
            local_48 = local_50;
            local_40 = dVar16;
          }
          if (((p->fMinWidth != 0) || (p->fMinApl != 0)) && (p->nNodesMaxAlloc * 2 <= p->nNodesCur))
          {
            reoResizeStructures(p,0,p->nNodesCur,0);
          }
          lVar3 = lVar3 + -0x38;
        }
        iVar12 = uVar2 - 1;
        if (uVar2 == 0) {
          iVar12 = 0;
        }
        lVar10 = (long)iVar12 * 7 + 0xc;
        lVar3 = (long)iVar12;
        while( true ) {
          lVar14 = lVar3 + 1;
          iVar5 = (int)uVar15;
          if ((long)p->nSupp + -1 <= lVar3) break;
          dVar16 = reoReorderSwapAdjacentVars(p,iVar12,0);
          local_50 = local_50 - dVar16;
          pdVar4 = p->pVarCosts;
          dVar16 = pdVar4[lVar14];
          if (((dVar16 != 10000000.0) || (NAN(dVar16))) && (1e-07 < ABS(dVar16 - local_50))) {
            puts("reoReorderSift(): Error! On the backward move, the costs are different.");
            pdVar4 = p->pVarCosts;
          }
          pdVar4[lVar14] = local_50;
          prVar1 = p->pPlanes;
          dVar16 = *(double *)((long)prVar1 + lVar10 * 8 + -0x40) +
                   *(double *)((long)prVar1 + lVar10 * 8 + -0x48);
          *(double *)((long)prVar1 + lVar10 * 8 + -8) = dVar16;
          if ((iVar5 <= lVar14) &&
             ((local_40 <= local_50 ||
              (local_48 <=
               dVar16 + (*(double *)(&prVar1->fSifted + lVar10 * 2) +
                        *(double *)(&prVar1->fSifted + lVar10 * 2)) / 3.0)))) {
            iVar12 = iVar12 + 1;
            break;
          }
          dVar16 = local_40;
          if (local_50 <= local_48) {
            dVar16 = (double)((int)(local_50 * 1.15) + 1);
            uVar15 = (ulong)(iVar12 + 1);
            local_48 = local_50;
            if (local_40 <= dVar16) {
              dVar16 = local_40;
            }
          }
          local_40 = dVar16;
          if (((p->fMinWidth != 0) || (p->fMinApl != 0)) && (p->nNodesMaxAlloc * 2 <= p->nNodesCur))
          {
            reoResizeStructures(p,0,p->nNodesCur,0);
          }
          lVar10 = lVar10 + 7;
          iVar12 = iVar12 + 1;
          lVar3 = lVar14;
        }
        if (iVar12 < iVar5) {
          __assert_fail("q >= BestQ",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoSift.c"
                        ,0xcb,"void reoReorderSift(reo_man *)");
        }
        for (lVar3 = (long)iVar12; iVar12 = iVar12 + -1, iVar5 < lVar3; lVar3 = lVar3 + -1) {
          dVar16 = reoReorderSwapAdjacentVars(p,iVar12,1);
          local_50 = local_50 - dVar16;
          if (1e-07 < ABS(p->pVarCosts[lVar3 + -1] - local_50)) {
            puts("reoReorderSift():  Error! On the return move, the costs are different.");
            fflush(_stdout);
          }
        }
      }
      else {
        for (lVar3 = 0; uVar7 * 0x38 - lVar3 != 0; lVar3 = lVar3 + 0x38) {
          *(double *)((long)&prVar1[1].statsCostAbove + lVar3) =
               *(double *)((long)&prVar1->statsCostAbove + lVar3) +
               *(double *)((long)&prVar1->statsCost + lVar3);
        }
        lVar3 = (long)(int)uVar2;
        pdVar4 = &prVar1[lVar3].statsCostBelow;
        dVar16 = 0.0;
        for (; *pdVar4 = dVar16, (long)uVar13 < lVar3; lVar3 = lVar3 + -1) {
          dVar16 = *pdVar4 + pdVar4[-2];
          pdVar4 = pdVar4 + -7;
        }
        dVar16 = prVar1[uVar13].statsCostAbove + prVar1[uVar13].statsCost +
                 prVar1[uVar13].statsCostBelow;
        if ((local_50 != dVar16) || (NAN(local_50) || NAN(dVar16))) {
          __assert_fail("CostCurrent == p->pPlanes[VarCurrent].statsCostAbove + p->pPlanes[VarCurrent].statsCost + p->pPlanes[VarCurrent].statsCostBelow"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoSift.c"
                        ,0xe4,"void reoReorderSift(reo_man *)");
        }
        lVar3 = uVar13 * 7 + 0xc;
        for (; (long)uVar13 < (long)((int)uVar6 + -1); uVar13 = uVar13 + 1) {
          iVar12 = (int)uVar13;
          dVar16 = reoReorderSwapAdjacentVars(p,iVar12,0);
          local_50 = local_50 - dVar16;
          p->pVarCosts[uVar13 + 1] = local_50;
          prVar1 = p->pPlanes;
          dVar16 = *(double *)((long)prVar1 + lVar3 * 8 + -0x40) +
                   *(double *)((long)prVar1 + lVar3 * 8 + -0x48);
          *(double *)((long)prVar1 + lVar3 * 8 + -8) = dVar16;
          if ((local_40 <= local_50) ||
             (local_48 <=
              dVar16 + (*(double *)(&prVar1->fSifted + lVar3 * 2) +
                       *(double *)(&prVar1->fSifted + lVar3 * 2)) / 3.0)) {
            uVar13 = (ulong)(iVar12 + 1);
            break;
          }
          dVar16 = local_40;
          if (local_50 < local_48) {
            dVar16 = (double)((int)(local_50 * 1.15) + 1);
            uVar15 = (ulong)(iVar12 + 1);
            local_48 = local_50;
            if (local_40 <= dVar16) {
              dVar16 = local_40;
            }
          }
          local_40 = dVar16;
          if (((p->fMinWidth != 0) || (p->fMinApl != 0)) && (p->nNodesMaxAlloc * 2 <= p->nNodesCur))
          {
            reoResizeStructures(p,0,p->nNodesCur,0);
          }
          uVar6 = (ulong)(uint)p->nSupp;
          lVar3 = lVar3 + 7;
        }
        uVar6 = uVar13 & 0xffffffff;
        lVar3 = uVar6 * 0x38 + 0x28;
        while( true ) {
          uVar11 = (uint)uVar6;
          iVar12 = (int)uVar15;
          uVar2 = (int)(uint)uVar13 >> 0x1f & (uint)uVar13;
          if ((int)uVar11 < 1) break;
          uVar6 = uVar6 - 1;
          dVar16 = reoReorderSwapAdjacentVars(p,(int)uVar6,1);
          local_50 = local_50 - dVar16;
          pdVar4 = p->pVarCosts;
          uVar7 = uVar6 & 0xffffffff;
          dVar16 = pdVar4[uVar7];
          if (((dVar16 != 10000000.0) || (NAN(dVar16))) && (1e-07 < ABS(dVar16 - local_50))) {
            puts("reoReorderSift(): Error! On the backward move, the costs are different.");
            pdVar4 = p->pVarCosts;
          }
          pdVar4[uVar7] = local_50;
          prVar1 = p->pPlanes;
          dVar16 = *(double *)((long)&prVar1->fSifted + lVar3) +
                   *(double *)((long)prVar1 + lVar3 + -0x10);
          prVar1[uVar7].statsCostBelow = dVar16;
          if (((int)uVar6 <= iVar12) &&
             ((uVar2 = uVar11, local_40 <= local_50 ||
              (local_48 <=
               dVar16 + (prVar1[uVar7].statsCostAbove + prVar1[uVar7].statsCostAbove) / 3.0))))
          break;
          if (local_50 <= local_48) {
            dVar16 = (double)((int)(local_50 * 1.15) + 1);
            if (local_40 <= dVar16) {
              dVar16 = local_40;
            }
            uVar15 = uVar6 & 0xffffffff;
            local_48 = local_50;
            local_40 = dVar16;
          }
          if (((p->fMinWidth != 0) || (p->fMinApl != 0)) && (p->nNodesMaxAlloc * 2 <= p->nNodesCur))
          {
            reoResizeStructures(p,0,p->nNodesCur,0);
          }
          lVar3 = lVar3 + -0x38;
        }
        iVar5 = uVar2 - 1;
        if (uVar2 == 0) {
          iVar5 = 0;
        }
        if (iVar12 < iVar5) {
          __assert_fail("q <= BestQ",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoSift.c"
                        ,0x139,"void reoReorderSift(reo_man *)");
        }
        for (lVar3 = (long)iVar5; lVar3 < iVar12; lVar3 = lVar3 + 1) {
          dVar16 = reoReorderSwapAdjacentVars(p,(int)lVar3,0);
          local_50 = local_50 - dVar16;
          if (1e-07 < ABS(p->pVarCosts[lVar3 + 1] - local_50)) {
            puts("reoReorderSift(): Error! On the return move, the costs are different.");
            fflush(_stdout);
          }
        }
      }
      if (1e-07 <= ABS(local_48 - local_50)) {
        __assert_fail("fabs( CostBest - CostCurrent ) < REO_COST_EPSILON",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoSift.c"
                      ,0x145,"void reoReorderSift(reo_man *)");
      }
      if (p->fMinWidth == 0) {
        if (p->fMinApl == 0) {
          p->nNodesCur = (int)local_48;
        }
        else {
          p->nAplCur = local_50;
        }
      }
      else {
        p->nWidthCur = (int)local_48;
      }
      iVar9 = iVar9 + 1;
      uVar2 = p->nSupp;
    }
    __assertion = "VarCurrent != -1";
    uVar2 = 0x5a;
  }
LAB_0067e4eb:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoSift.c"
                ,uVar2,"void reoReorderSift(reo_man *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                    FUNCTION DEFINITIONS                          ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Implements the variable sifting algorithm.]

  Description [Performs a sequence of adjacent variable swaps known as "sifting".
  Uses the cost functions determined by the flag.]

  SideEffects []

  SeeAlso     []

***********************************************************************/
void reoReorderSift( reo_man * p )
{
    double CostCurrent;  // the cost of the current permutation
    double CostLimit;    // the maximum increase in cost that can be tolerated
    double CostBest;     // the best cost
    int BestQ;           // the best position
    int VarCurrent;      // the current variable to move   
    int q;               // denotes the current position of the variable
    int c;               // performs the loops over variables until all of them are sifted
    int v;               // used for other purposes

    assert( p->nSupp > 0 );

    // set the current cost depending on the minimization criteria
    if ( p->fMinWidth )
        CostCurrent = p->nWidthCur;
    else if ( p->fMinApl )
        CostCurrent = p->nAplCur;
    else
        CostCurrent = p->nNodesCur;

    // find the upper bound on tbe cost growth
    CostLimit = 1 + (int)(REO_REORDER_LIMIT * CostCurrent);

    // perform sifting for each of p->nSupp variables
    for ( c = 0; c < p->nSupp; c++ )
    {
        // select the current variable to be the one with the largest number of nodes that is not sifted yet
        VarCurrent = -1;
        CostBest   = -1.0;
        for ( v = 0; v < p->nSupp; v++ )
        {
            p->pVarCosts[v] = REO_HIGH_VALUE;
            if ( !p->pPlanes[v].fSifted )
            {
//                VarCurrent = v;
//                if ( CostBest < p->pPlanes[v].statsCost )
                if ( CostBest < p->pPlanes[v].statsNodes )
                {
//                    CostBest   = p->pPlanes[v].statsCost;
                    CostBest   = p->pPlanes[v].statsNodes;
                    VarCurrent = v;
                }

            }
        }
        assert( VarCurrent != -1 );
        // mark this variable as sifted
        p->pPlanes[VarCurrent].fSifted = 1;

        // set the current value
        p->pVarCosts[VarCurrent] = CostCurrent;

        // set the best cost
        CostBest = CostCurrent;
        BestQ    = VarCurrent; 

        // determine which way to move the variable first (up or down)
        // the rationale is that if we move the shorter way first
        // it is more likely that the best position will be found on the longer way
        // and the reverse movement (to take the best position) will be faster
        if ( VarCurrent < p->nSupp/2 ) // move up first, then down
        {
            // set the total cost on all levels above the current level
            p->pPlanes[0].statsCostAbove = 0;
            for ( v = 1; v <= VarCurrent; v++ )
                p->pPlanes[v].statsCostAbove = p->pPlanes[v-1].statsCostAbove + p->pPlanes[v-1].statsCost;
            // set the total cost on all levels below the current level
            p->pPlanes[p->nSupp].statsCostBelow = 0;
            for ( v = p->nSupp - 1; v >= VarCurrent; v-- )
                p->pPlanes[v].statsCostBelow = p->pPlanes[v+1].statsCostBelow + p->pPlanes[v+1].statsCost;

            assert( CostCurrent == p->pPlanes[VarCurrent].statsCostAbove + 
                                    p->pPlanes[VarCurrent].statsCost +
                                    p->pPlanes[VarCurrent].statsCostBelow );

            // move up
            for ( q = VarCurrent-1; q >= 0; q-- )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q, 1 );
                // now q points to the position of this var in the order
                p->pVarCosts[q] = CostCurrent;
                // update the lower bound (assuming that for level q+1 it is set correctly)
                p->pPlanes[q].statsCostBelow = p->pPlanes[q+1].statsCostBelow + p->pPlanes[q+1].statsCost;
                // check the upper bound
                if ( CostCurrent >= CostLimit )
                    break;
                // check the lower bound
                if ( p->pPlanes[q].statsCostBelow + (REO_QUAL_PAR-1)*p->pPlanes[q].statsCostAbove/REO_QUAL_PAR >= CostBest )
                    break;
                // update the best cost
                if ( CostBest > CostCurrent )
                {
                    CostBest = CostCurrent;
                    BestQ    = q;
                    // adjust node limit
                    CostLimit = ddMin( CostLimit, 1 + (int)(REO_REORDER_LIMIT * CostCurrent) );
                }

                // when we are reordering for width or APL, it may happen that
                // the number of nodes has grown above certain limit,
                // in which case we have to resize the data structures
                if ( p->fMinWidth || p->fMinApl )
                {
                    if ( p->nNodesCur >= 2 * p->nNodesMaxAlloc )
                    {
//                        printf( "Resizing data structures. Old size = %6d. New size = %6d.\n",  p->nNodesMaxAlloc, p->nNodesCur );
                        reoResizeStructures( p, 0, p->nNodesCur, 0 );
                    }
                }
            }
            // fix the plane index
            if ( q == -1 )
                q++;
            // now p points to the position of this var in the order

            // move down
            for ( ; q < p->nSupp-1; )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q, 0 );
                q++;    // change q to point to the position of this var in the order
                // sanity check: the number of nodes on the back pass should be the same
                if ( p->pVarCosts[q] != REO_HIGH_VALUE && fabs( p->pVarCosts[q] - CostCurrent ) > REO_COST_EPSILON )
                    printf("reoReorderSift(): Error! On the backward move, the costs are different.\n");
                p->pVarCosts[q] = CostCurrent;
                // update the lower bound (assuming that for level q-1 it is set correctly)
                p->pPlanes[q].statsCostAbove = p->pPlanes[q-1].statsCostAbove + p->pPlanes[q-1].statsCost;
                // check the bounds only if the variable already reached its previous position
                if ( q >= BestQ )
                {
                    // check the upper bound
                    if ( CostCurrent >= CostLimit )
                        break;
                    // check the lower bound
                    if ( p->pPlanes[q].statsCostAbove + (REO_QUAL_PAR-1)*p->pPlanes[q].statsCostBelow/REO_QUAL_PAR >= CostBest )
                        break;
                }
                // update the best cost
                if ( CostBest >= CostCurrent )
                {
                    CostBest = CostCurrent;
                    BestQ    = q;
                    // adjust node limit
                    CostLimit = ddMin( CostLimit, 1 + (int)(REO_REORDER_LIMIT * CostCurrent) );
                }

                // when we are reordering for width or APL, it may happen that
                // the number of nodes has grown above certain limit,
                // in which case we have to resize the data structures
                if ( p->fMinWidth || p->fMinApl )
                {
                    if ( p->nNodesCur >= 2 * p->nNodesMaxAlloc )
                    {
//                        printf( "Resizing data structures. Old size = %6d. New size = %6d.\n",  p->nNodesMaxAlloc, p->nNodesCur );
                        reoResizeStructures( p, 0, p->nNodesCur, 0 );
                    }
                }
            }
            // move the variable up from the given position (q) to the best position (BestQ)
            assert( q >= BestQ );
            for ( ; q > BestQ; q-- )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q-1, 1 );
                // sanity check: the number of nodes on the back pass should be the same
                if ( fabs( p->pVarCosts[q-1] - CostCurrent ) > REO_COST_EPSILON )
                {
                    printf("reoReorderSift():  Error! On the return move, the costs are different.\n" );
                    fflush(stdout);
                }
            }
        }
        else // move down first, then up
        {
            // set the current number of nodes on all levels above the given level
            p->pPlanes[0].statsCostAbove = 0;
            for ( v = 1; v <= VarCurrent; v++ )
                p->pPlanes[v].statsCostAbove = p->pPlanes[v-1].statsCostAbove + p->pPlanes[v-1].statsCost;
            // set the current number of nodes on all levels below the given level
            p->pPlanes[p->nSupp].statsCostBelow = 0;
            for ( v = p->nSupp - 1; v >= VarCurrent; v-- )
                p->pPlanes[v].statsCostBelow = p->pPlanes[v+1].statsCostBelow + p->pPlanes[v+1].statsCost;
            
            assert( CostCurrent == p->pPlanes[VarCurrent].statsCostAbove + 
                                    p->pPlanes[VarCurrent].statsCost +
                                    p->pPlanes[VarCurrent].statsCostBelow );

            // move down
            for ( q = VarCurrent; q < p->nSupp-1; )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q, 0 );
                q++;    // change q to point to the position of this var in the order
                p->pVarCosts[q] = CostCurrent;
                // update the lower bound (assuming that for level q-1 it is set correctly)
                p->pPlanes[q].statsCostAbove = p->pPlanes[q-1].statsCostAbove + p->pPlanes[q-1].statsCost;
                // check the upper bound
                if ( CostCurrent >= CostLimit )
                    break;
                // check the lower bound
                if ( p->pPlanes[q].statsCostAbove + (REO_QUAL_PAR-1)*p->pPlanes[q].statsCostBelow/REO_QUAL_PAR >= CostBest )
                    break;
                // update the best cost
                if ( CostBest > CostCurrent )
                {
                    CostBest = CostCurrent;
                    BestQ    = q;
                    // adjust node limit
                    CostLimit = ddMin( CostLimit, 1 + (int)(REO_REORDER_LIMIT * CostCurrent) );
                }

                // when we are reordering for width or APL, it may happen that
                // the number of nodes has grown above certain limit,
                // in which case we have to resize the data structures
                if ( p->fMinWidth || p->fMinApl )
                {
                    if ( p->nNodesCur >= 2 * p->nNodesMaxAlloc )
                    {
//                        printf( "Resizing data structures. Old size = %6d. New size = %6d.\n",  p->nNodesMaxAlloc, p->nNodesCur );
                        reoResizeStructures( p, 0, p->nNodesCur, 0 );
                    }
                }
            }

            // move up
            for ( --q; q >= 0; q-- )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q, 1 );
                // now q points to the position of this var in the order
                // sanity check: the number of nodes on the back pass should be the same
                if ( p->pVarCosts[q] != REO_HIGH_VALUE && fabs( p->pVarCosts[q] - CostCurrent ) > REO_COST_EPSILON )
                    printf("reoReorderSift(): Error! On the backward move, the costs are different.\n");
                p->pVarCosts[q] = CostCurrent;
                // update the lower bound (assuming that for level q+1 it is set correctly)
                p->pPlanes[q].statsCostBelow = p->pPlanes[q+1].statsCostBelow + p->pPlanes[q+1].statsCost;
                // check the bounds only if the variable already reached its previous position
                if ( q <= BestQ )
                {
                    // check the upper bound
                    if ( CostCurrent >= CostLimit )
                        break;
                    // check the lower bound
                    if ( p->pPlanes[q].statsCostBelow + (REO_QUAL_PAR-1)*p->pPlanes[q].statsCostAbove/REO_QUAL_PAR >= CostBest )
                        break;
                }
                // update the best cost
                if ( CostBest >= CostCurrent )
                {
                    CostBest = CostCurrent;
                    BestQ    = q;
                    // adjust node limit
                    CostLimit = ddMin( CostLimit, 1 + (int)(REO_REORDER_LIMIT * CostCurrent) );
                }

                // when we are reordering for width or APL, it may happen that
                // the number of nodes has grown above certain limit,
                // in which case we have to resize the data structures
                if ( p->fMinWidth || p->fMinApl )
                {
                    if ( p->nNodesCur >= 2 * p->nNodesMaxAlloc )
                    {
//                        printf( "Resizing data structures. Old size = %6d. New size = %6d.\n",  p->nNodesMaxAlloc, p->nNodesCur );
                        reoResizeStructures( p, 0, p->nNodesCur, 0 );
                    }
                }
            }
            // fix the plane index
            if ( q == -1 )
                q++;
            // now q points to the position of this var in the order
            // move the variable down from the given position (q) to the best position (BestQ)
            assert( q <= BestQ );
            for ( ; q < BestQ; q++ )
            {
                CostCurrent -= reoReorderSwapAdjacentVars( p, q, 0 );
                // sanity check: the number of nodes on the back pass should be the same
                if ( fabs( p->pVarCosts[q+1] - CostCurrent ) > REO_COST_EPSILON )
                {
                    printf("reoReorderSift(): Error! On the return move, the costs are different.\n" );
                    fflush(stdout);
                }
            }
        }
        assert( fabs( CostBest - CostCurrent ) < REO_COST_EPSILON );

        // update the cost 
        if ( p->fMinWidth )
            p->nWidthCur = (int)CostBest;
        else if ( p->fMinApl )
            p->nAplCur = CostCurrent;
        else
            p->nNodesCur = (int)CostBest;
    }

    // remove the sifted attributes if any
    for ( v = 0; v < p->nSupp; v++ )
        p->pPlanes[v].fSifted = 0;
}